

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall Display::run(Display *this)

{
  bool bVar1;
  int key;
  runtime_error *this_00;
  element_type *peVar2;
  Display *this_local;
  
  while( true ) {
    if (((this->exit ^ 0xffU) & 1) == 0) {
      return;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io);
    if (!bVar1) break;
    peVar2 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->io);
    (*peVar2->_vptr_IODevice[7])(peVar2,0);
    calculateStates(this);
    renderBoard(this);
    renderStatusline(this);
    updateCursor(this);
    key = getKey(this);
    handleKey(this,key);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"OMG io is NULL");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Display::run() {
    while(!exit) {
        // rendering process
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
        io->setCursorVisibility(0);
        calculateStates();
        renderBoard();
        renderStatusline();
        updateCursor();
        handleKey(getKey());
    }
}